

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
TiXmlDocument::Parse(TiXmlDocument *this,char *p,TiXmlParsingData *prevData,TiXmlEncoding encoding)

{
  int iVar1;
  int iVar2;
  TiXmlCursor *pTVar3;
  TiXmlNode *node_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *p_00;
  bool bVar4;
  char *enc;
  TiXmlDeclaration *dec;
  TiXmlNode *node;
  uchar *pU;
  TiXmlParsingData data;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *prevData_local;
  char *p_local;
  TiXmlDocument *this_local;
  
  data._20_4_ = encoding;
  ClearError(this);
  if ((p == (char *)0x0) || (*p == '\0')) {
    SetError(this,0xc,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
    this_local = (TiXmlDocument *)0x0;
  }
  else {
    TiXmlCursor::Clear(&(this->super_TiXmlNode).super_TiXmlBase.location);
    if (prevData == (TiXmlParsingData *)0x0) {
      (this->super_TiXmlNode).super_TiXmlBase.location.row = 0;
      (this->super_TiXmlNode).super_TiXmlBase.location.col = 0;
    }
    else {
      (this->super_TiXmlNode).super_TiXmlBase.location.row = (prevData->cursor).row;
      (this->super_TiXmlNode).super_TiXmlBase.location.col = (prevData->cursor).col;
    }
    iVar1 = TabSize(this);
    TiXmlParsingData::TiXmlParsingData
              ((TiXmlParsingData *)&pU,p,iVar1,(this->super_TiXmlNode).super_TiXmlBase.location.row,
               (this->super_TiXmlNode).super_TiXmlBase.location.col);
    pTVar3 = TiXmlParsingData::Cursor((TiXmlParsingData *)&pU);
    (this->super_TiXmlNode).super_TiXmlBase.location = *pTVar3;
    if (((((data._20_4_ == 0) && (*p != '\0')) && (*p == -0x11)) &&
        ((p[1] != '\0' && (p[1] == -0x45)))) && ((p[2] != '\0' && (p[2] == -0x41)))) {
      data._20_4_ = 1;
      this->useMicrosoftBOM = true;
    }
    prevData_local = (TiXmlParsingData *)TiXmlBase::SkipWhiteSpace(p,data._20_4_);
    if (prevData_local == (TiXmlParsingData *)0x0) {
      SetError(this,0xc,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      this_local = (TiXmlDocument *)0x0;
    }
    else {
      while( true ) {
        bVar4 = false;
        if (prevData_local != (TiXmlParsingData *)0x0) {
          bVar4 = (char)(prevData_local->cursor).row != '\0';
        }
        if ((!bVar4) ||
           (node_00 = TiXmlNode::Identify(&this->super_TiXmlNode,(char *)prevData_local,data._20_4_)
           , node_00 == (TiXmlNode *)0x0)) break;
        iVar1 = (*(node_00->super_TiXmlBase)._vptr_TiXmlBase[3])(node_00,prevData_local,&pU);
        TiXmlNode::LinkEndChild(&this->super_TiXmlNode,node_00);
        if ((data._20_4_ == 0) &&
           (iVar2 = (*(node_00->super_TiXmlBase)._vptr_TiXmlBase[0xf])(),
           CONCAT44(extraout_var_00,iVar2) != 0)) {
          iVar2 = (*(node_00->super_TiXmlBase)._vptr_TiXmlBase[0xf])();
          p_00 = TiXmlDeclaration::Encoding((TiXmlDeclaration *)CONCAT44(extraout_var_01,iVar2));
          if (p_00 == (char *)0x0) {
            __assert_fail("enc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxmlparser.cpp"
                          ,0x305,
                          "virtual const char *TiXmlDocument::Parse(const char *, TiXmlParsingData *, TiXmlEncoding)"
                         );
          }
          if (*p_00 == '\0') {
            data._20_4_ = 1;
          }
          else {
            bVar4 = TiXmlBase::StringEqual(p_00,"UTF-8",true,TIXML_ENCODING_UNKNOWN);
            if (bVar4) {
              data._20_4_ = 1;
            }
            else {
              bVar4 = TiXmlBase::StringEqual(p_00,"UTF8",true,TIXML_ENCODING_UNKNOWN);
              if (bVar4) {
                data._20_4_ = 1;
              }
              else {
                data._20_4_ = 2;
              }
            }
          }
        }
        prevData_local =
             (TiXmlParsingData *)
             TiXmlBase::SkipWhiteSpace((char *)CONCAT44(extraout_var,iVar1),data._20_4_);
      }
      if ((this->super_TiXmlNode).firstChild == (TiXmlNode *)0x0) {
        SetError(this,0xc,(char *)0x0,(TiXmlParsingData *)0x0,data._20_4_);
        this_local = (TiXmlDocument *)0x0;
      }
      else {
        this_local = (TiXmlDocument *)prevData_local;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* TiXmlDocument::Parse( const char* p, TiXmlParsingData* prevData, TiXmlEncoding encoding )
{
	ClearError();

	// Parse away, at the document level. Since a document
	// contains nothing but other tags, most of what happens
	// here is skipping white space.
	if ( !p || !*p )
	{
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	// Note that, for a document, this needs to come
	// before the while space skip, so that parsing
	// starts from the pointer we are given.
	location.Clear();
	if ( prevData )
	{
		location.row = prevData->cursor.row;
		location.col = prevData->cursor.col;
	}
	else
	{
		location.row = 0;
		location.col = 0;
	}
	TiXmlParsingData data( p, TabSize(), location.row, location.col );
	location = data.Cursor();

	if ( encoding == TIXML_ENCODING_UNKNOWN )
	{
		// Check for the Microsoft UTF-8 lead bytes.
		const unsigned char* pU = (const unsigned char*)p;
		if (	*(pU+0) && *(pU+0) == TIXML_UTF_LEAD_0
			 && *(pU+1) && *(pU+1) == TIXML_UTF_LEAD_1
			 && *(pU+2) && *(pU+2) == TIXML_UTF_LEAD_2 )
		{
			encoding = TIXML_ENCODING_UTF8;
			useMicrosoftBOM = true;
		}
	}

    p = SkipWhiteSpace( p, encoding );
	if ( !p )
	{
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	while ( p && *p )
	{
		TiXmlNode* node = Identify( p, encoding );
		if ( node )
		{
			p = node->Parse( p, &data, encoding );
			LinkEndChild( node );
		}
		else
		{
			break;
		}

		// Did we get encoding info?
		if (    encoding == TIXML_ENCODING_UNKNOWN
			 && node->ToDeclaration() )
		{
			TiXmlDeclaration* dec = node->ToDeclaration();
			const char* enc = dec->Encoding();
			assert( enc );

			if ( *enc == 0 )
				encoding = TIXML_ENCODING_UTF8;
			else if ( StringEqual( enc, "UTF-8", true, TIXML_ENCODING_UNKNOWN ) )
				encoding = TIXML_ENCODING_UTF8;
			else if ( StringEqual( enc, "UTF8", true, TIXML_ENCODING_UNKNOWN ) )
				encoding = TIXML_ENCODING_UTF8;	// incorrect, but be nice
			else 
				encoding = TIXML_ENCODING_LEGACY;
		}

		p = SkipWhiteSpace( p, encoding );
	}

	// Was this empty?
	if ( !firstChild ) {
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, encoding );
		return 0;
	}

	// All is well.
	return p;
}